

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O0

Aig_Obj_t *
Cgt_ManConstructCareCondition
          (Cgt_Man_t *p,Aig_Man_t *pNew,Aig_Obj_t *pObjLo,Vec_Ptr_t *vCopy0,Vec_Ptr_t *vCopy1)

{
  Aig_Man_t *pAVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  int local_4c;
  int i;
  Aig_Obj_t *pTemp;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pMiter;
  Vec_Ptr_t *vCopy1_local;
  Vec_Ptr_t *vCopy0_local;
  Aig_Obj_t *pObjLo_local;
  Aig_Man_t *pNew_local;
  Cgt_Man_t *p_local;
  
  iVar2 = Aig_ObjIsCi(pObjLo);
  if (iVar2 == 0) {
    __assert_fail("Aig_ObjIsCi(pObjLo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cgt/cgtAig.c"
                  ,0xd8,
                  "Aig_Obj_t *Cgt_ManConstructCareCondition(Cgt_Man_t *, Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  Cgt_ManDetectFanout(p->pAig,pObjLo,p->pPars->nOdcMax,p->vFanout);
  Cgt_ManCollectVisited(p->pAig,p->vFanout,p->vVisited);
  local_4c = 0;
  while( true ) {
    iVar2 = Vec_PtrSize(p->vVisited);
    if (iVar2 <= local_4c) {
      for (local_4c = 0; iVar2 = Vec_PtrSize(p->vVisited), local_4c < iVar2; local_4c = local_4c + 1
          ) {
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vVisited,local_4c);
        pAVar6 = Aig_ObjChild0CopyVec(vCopy0,pAVar3);
        pAVar5 = Aig_ObjChild1CopyVec(vCopy0,pAVar3);
        pAVar6 = Aig_And(pNew,pAVar6,pAVar5);
        iVar2 = Aig_ObjId(pAVar3);
        Vec_PtrWriteEntry(vCopy0,iVar2,pAVar6);
        pAVar6 = Aig_ObjChild0CopyVec(vCopy1,pAVar3);
        pAVar5 = Aig_ObjChild1CopyVec(vCopy1,pAVar3);
        pAVar6 = Aig_And(pNew,pAVar6,pAVar5);
        iVar2 = Aig_ObjId(pAVar3);
        Vec_PtrWriteEntry(vCopy1,iVar2,pAVar6);
      }
      pObj = Aig_ManConst0(pNew);
      for (local_4c = 0; iVar2 = Vec_PtrSize(p->vFanout), local_4c < iVar2; local_4c = local_4c + 1)
      {
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vFanout,local_4c);
        iVar2 = Aig_ObjId(pAVar3);
        pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(vCopy0,iVar2);
        iVar2 = Aig_ObjId(pAVar3);
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vCopy1,iVar2);
        pAVar3 = Aig_Exor(pNew,pAVar6,pAVar3);
        pObj = Aig_Or(pNew,pObj,pAVar3);
      }
      return pObj;
    }
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vVisited,local_4c);
    iVar2 = Aig_ObjIsNode(pAVar3);
    if (iVar2 == 0) break;
    pAVar1 = p->pAig;
    pAVar6 = Aig_ObjFanin0(pAVar3);
    iVar2 = Saig_ObjIsPi(pAVar1,pAVar6);
    if (iVar2 != 0) {
      iVar2 = Aig_ObjFaninId0(pAVar3);
      pvVar4 = Vec_PtrEntry(vCopy0,iVar2);
      if (pvVar4 == (void *)0x0) {
        pAVar6 = Aig_ObjCreateCi(pNew);
        iVar2 = Aig_ObjFaninId0(pAVar3);
        Vec_PtrWriteEntry(vCopy0,iVar2,pAVar6);
        iVar2 = Aig_ObjFaninId0(pAVar3);
        Vec_PtrWriteEntry(vCopy1,iVar2,pAVar6);
      }
    }
    pAVar1 = p->pAig;
    pAVar6 = Aig_ObjFanin1(pAVar3);
    iVar2 = Saig_ObjIsPi(pAVar1,pAVar6);
    if (iVar2 != 0) {
      iVar2 = Aig_ObjFaninId1(pAVar3);
      pvVar4 = Vec_PtrEntry(vCopy0,iVar2);
      if (pvVar4 == (void *)0x0) {
        pAVar6 = Aig_ObjCreateCi(pNew);
        iVar2 = Aig_ObjFaninId1(pAVar3);
        Vec_PtrWriteEntry(vCopy0,iVar2,pAVar6);
        iVar2 = Aig_ObjFaninId1(pAVar3);
        Vec_PtrWriteEntry(vCopy1,iVar2,pAVar6);
      }
    }
    local_4c = local_4c + 1;
  }
  __assert_fail("Aig_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cgt/cgtAig.c"
                ,0xdf,
                "Aig_Obj_t *Cgt_ManConstructCareCondition(Cgt_Man_t *, Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
               );
}

Assistant:

Aig_Obj_t * Cgt_ManConstructCareCondition( Cgt_Man_t * p, Aig_Man_t * pNew, Aig_Obj_t * pObjLo, Vec_Ptr_t * vCopy0, Vec_Ptr_t * vCopy1 )
{
    Aig_Obj_t * pMiter, * pObj, * pTemp;
    int i;
    assert( Aig_ObjIsCi(pObjLo) );
    // detect nodes and their cone
    Cgt_ManDetectFanout( p->pAig, pObjLo, p->pPars->nOdcMax, p->vFanout );
    Cgt_ManCollectVisited( p->pAig, p->vFanout, p->vVisited );
    // add new variables if the observability condition depends on PI variables
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vVisited, pObj, i )
    {
        assert( Aig_ObjIsNode(pObj) );
        if ( Saig_ObjIsPi(p->pAig, Aig_ObjFanin0(pObj)) && Vec_PtrEntry(vCopy0, Aig_ObjFaninId0(pObj)) == NULL )
        {
            pTemp = Aig_ObjCreateCi( pNew );
            Vec_PtrWriteEntry( vCopy0, Aig_ObjFaninId0(pObj), pTemp );
            Vec_PtrWriteEntry( vCopy1, Aig_ObjFaninId0(pObj), pTemp );
        }
        if ( Saig_ObjIsPi(p->pAig, Aig_ObjFanin1(pObj)) && Vec_PtrEntry(vCopy0, Aig_ObjFaninId1(pObj)) == NULL )
        {
            pTemp = Aig_ObjCreateCi( pNew );
            Vec_PtrWriteEntry( vCopy0, Aig_ObjFaninId1(pObj), pTemp );
            Vec_PtrWriteEntry( vCopy1, Aig_ObjFaninId1(pObj), pTemp );
        }
    }
    // construct AIGs for the nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vVisited, pObj, i )
    {
        pTemp = Aig_And( pNew, Aig_ObjChild0CopyVec(vCopy0, pObj), Aig_ObjChild1CopyVec(vCopy0, pObj) );
        Vec_PtrWriteEntry( vCopy0, Aig_ObjId(pObj), pTemp );
        pTemp = Aig_And( pNew, Aig_ObjChild0CopyVec(vCopy1, pObj), Aig_ObjChild1CopyVec(vCopy1, pObj) );
        Vec_PtrWriteEntry( vCopy1, Aig_ObjId(pObj), pTemp );
    }
    // construct the care miter
    pMiter = Aig_ManConst0( pNew );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vFanout, pObj, i )
    {
        pTemp = Aig_Exor( pNew, (Aig_Obj_t *)Vec_PtrEntry(vCopy0, Aig_ObjId(pObj)), (Aig_Obj_t *)Vec_PtrEntry(vCopy1, Aig_ObjId(pObj)) );
        pMiter = Aig_Or( pNew, pMiter, pTemp );
    }
    return pMiter;
}